

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O2

size_t __thiscall Extension::SetDataSize(Extension *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  if ((this->critical).b == '\0') {
    sVar1 = 0;
  }
  else {
    sVar1 = DerBase::EncodedSize(&(this->critical).super_DerBase);
  }
  sVar2 = DerBase::EncodedSize(&(this->extnID).super_DerBase);
  sVar3 = DerBase::EncodedSize(&(this->extnValue).super_DerBase);
  sVar3 = sVar3 + sVar2 + sVar1;
  (this->super_DerBase).cbData = sVar3;
  return sVar3;
}

Assistant:

virtual size_t SetDataSize() override
	{
		size_t cbCritical = critical.GetValue() ? critical.EncodedSize() : 0;
		cbData = extnID.EncodedSize() + cbCritical + extnValue.EncodedSize();
		return cbData;
	}